

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Nested.cpp
# Opt level: O0

tuple<NS_*,_NS_*> test_graphs::simple(void)

{
  NS *data;
  N *this;
  NS *graph;
  N *size;
  char *data_00;
  N *this_00;
  N *pNVar1;
  void *pvVar2;
  _Head_base<0UL,_NS_*,_false> extraout_RDX;
  _Tuple_impl<1UL,_NS_*> in_RDI;
  tuple<NS_*,_NS_*> tVar3;
  N *b;
  N *a;
  N *p;
  N *n;
  N *el;
  N *has;
  NS *sub_g;
  NS *g;
  NS *in_stack_ffffffffffffff48;
  size_t in_stack_ffffffffffffff50;
  char *in_stack_ffffffffffffff58;
  N *in_stack_ffffffffffffff60;
  void *local_78;
  sockaddr *local_70;
  undefined8 local_68;
  char *local_60;
  sockaddr *local_58;
  undefined8 local_50;
  void *local_48;
  N *local_40;
  N *local_38;
  char *local_30;
  N *local_28;
  NS *local_20;
  N *local_18;
  NS *local_10;
  
  data = (NS *)operator_new(0x18);
  memset(data,0,0x18);
  NS::NS((NS *)0x1a4ea2);
  local_10 = data;
  this = (N *)operator_new(0x18);
  memset(this,0,0x18);
  NS::NS((NS *)0x1a4ed6);
  local_18 = this;
  graph = (NS *)N::operator_new(in_stack_ffffffffffffff50,in_stack_ffffffffffffff48);
  N::N<char_const*>(in_stack_ffffffffffffff60,in_stack_ffffffffffffff58);
  local_20 = graph;
  size = (N *)N::operator_new(in_stack_ffffffffffffff50,graph);
  N::N<char_const*>(in_stack_ffffffffffffff60,in_stack_ffffffffffffff58);
  local_28 = size;
  data_00 = (char *)N::operator_new((size_t)size,graph);
  N::N<NS*>(this,data);
  local_30 = data_00;
  this_00 = (N *)N::operator_new((size_t)size,graph);
  N::N<char_const*>(this_00,data_00);
  local_38 = this_00;
  pNVar1 = (N *)N::operator_new((size_t)size,graph);
  N::N<char_const*>(this_00,data_00);
  local_40 = pNVar1;
  pvVar2 = N::operator_new((size_t)size,graph);
  N::N<char_const*>(this_00,data_00);
  local_60 = local_30;
  local_58 = (sockaddr *)&local_60;
  local_50 = 1;
  local_48 = pvVar2;
  N::connect(local_28,(int)local_20,local_58,1);
  local_78 = local_48;
  local_70 = (sockaddr *)&local_78;
  local_68 = 1;
  N::connect(local_40,(int)local_38,local_70,1);
  std::tuple<NS_*,_NS_*>::tuple<NS_*&,_NS_*&,_true>
            ((tuple<NS_*,_NS_*> *)this,(NS **)data,(NS **)0x1a50ae);
  tVar3.super__Tuple_impl<0UL,_NS_*,_NS_*>.super__Head_base<0UL,_NS_*,_false>._M_head_impl =
       extraout_RDX._M_head_impl;
  tVar3.super__Tuple_impl<0UL,_NS_*,_NS_*>.super__Tuple_impl<1UL,_NS_*>.
  super__Head_base<1UL,_NS_*,_false>._M_head_impl =
       in_RDI.super__Head_base<1UL,_NS_*,_false>._M_head_impl;
  return (tuple<NS_*,_NS_*>)tVar3.super__Tuple_impl<0UL,_NS_*,_NS_*>;
}

Assistant:

std::tuple<NS*, NS*> simple() {
        auto g = new NS();
        auto sub_g = new NS();
        auto has = new(g) N("has nested"), el = new(g) N("element"), n = new(g) N(sub_g);
        auto p = new(g) N("p"), a = new(g) N("a"), b = new(sub_g) N("b");

        el->connect(has, {n});
        a->connect(p, {b});

        return {g, sub_g};
    }